

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxInputManager.cpp
# Opt level: O3

void __thiscall
OIS::LinuxInputManager::_parseConfigSettings(LinuxInputManager *this,ParamList *paramList)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  iterator iVar4;
  ulonglong uVar5;
  key_type local_48;
  
  paVar2 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"WINDOW","");
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&paramList->_M_t,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  p_Var1 = &(paramList->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
    puts("OIS: No Window specified... Not using x11 keyboard/mouse");
  }
  else {
    uVar5 = strtoull(*(char **)(iVar4._M_node + 2),(char **)0x0,10);
    this->window = uVar5;
    local_48._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"x11_keyboard_grab","");
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&paramList->_M_t,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
      iVar3 = std::__cxx11::string::compare((char *)(iVar4._M_node + 2));
      if (iVar3 == 0) {
        this->grabKeyboard = false;
      }
    }
    local_48._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"x11_mouse_grab","");
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&paramList->_M_t,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
      iVar3 = std::__cxx11::string::compare((char *)(iVar4._M_node + 2));
      if (iVar3 == 0) {
        this->grabMouse = false;
      }
    }
    local_48._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"x11_mouse_hide","");
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&paramList->_M_t,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    if ((_Rb_tree_header *)iVar4._M_node != p_Var1) {
      iVar3 = std::__cxx11::string::compare((char *)(iVar4._M_node + 2));
      if (iVar3 == 0) {
        this->hideMouse = false;
      }
    }
  }
  return;
}

Assistant:

void LinuxInputManager::_parseConfigSettings(ParamList& paramList)
{
	ParamList::iterator i = paramList.find("WINDOW");
	if(i == paramList.end())
	{
		printf("OIS: No Window specified... Not using x11 keyboard/mouse\n");
		return;
	}

	window = strtoull(i->second.c_str(), 0, 10);

	//--------- Keyboard Settings ------------//
	i = paramList.find("x11_keyboard_grab");
	if(i != paramList.end())
		if(i->second == "false")
			grabKeyboard = false;

	//--------- Mouse Settings ------------//
	i = paramList.find("x11_mouse_grab");
	if(i != paramList.end())
		if(i->second == "false")
			grabMouse = false;

	i = paramList.find("x11_mouse_hide");
	if(i != paramList.end())
		if(i->second == "false")
			hideMouse = false;
}